

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsc_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
unsubscribe_event_handlers
          (limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>
           *this,type_index *param_1,agent_t *subscriber)

{
  allocator local_49;
  string local_48 [32];
  lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_> local_28;
  lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_> lock;
  agent_t *subscriber_local;
  type_index *param_1_local;
  limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this_local;
  
  lock._M_device = (mutex_type *)subscriber;
  std::lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_>::lock_guard(&local_28,&this->m_lock);
  if ((agent_t *)lock._M_device != this->m_single_consumer) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,"the only one consumer can remove subscription to mpsc_mbox",&local_49);
    exception_t::raise(0x51c001);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  if (this->m_subscriptions_count != 0) {
    this->m_subscriptions_count = this->m_subscriptions_count - 1;
  }
  std::lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_>::~lock_guard(&local_28);
  return;
}

Assistant:

virtual void
		unsubscribe_event_handlers(
			const std::type_index & /*msg_type*/,
			agent_t * subscriber ) override
			{
				std::lock_guard< default_rw_spinlock_t > lock{ m_lock };

				if( subscriber != m_single_consumer )
					SO_5_THROW_EXCEPTION(
							rc_illegal_subscriber_for_mpsc_mbox,
							"the only one consumer can remove subscription to mpsc_mbox" );
				if( m_subscriptions_count )
					--m_subscriptions_count;
			}